

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O2

void itrans_dct2_h16_w8_avx2(s16 *src,s16 *dst,int bit_depth)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  s16 tmp [128];
  s16 local_120 [16];
  undefined1 auStack_100 [32];
  undefined1 auStack_e0 [32];
  undefined1 auStack_c0 [32];
  undefined1 auStack_a0 [32];
  undefined1 auStack_80 [32];
  undefined1 auStack_60 [32];
  undefined1 auStack_40 [40];
  
  dct2_butterfly_h16_avx2(src,8,local_120,8,5,0xf);
  uVar11 = 0x14 - bit_depth;
  bVar1 = 0x13U - (char)bit_depth & 0x1f;
  iVar9 = 1 << bVar1;
  auVar12._4_4_ = iVar9;
  auVar12._0_4_ = iVar9;
  auVar12._8_4_ = iVar9;
  auVar12._12_4_ = iVar9;
  auVar12._16_4_ = iVar9;
  auVar12._20_4_ = iVar9;
  auVar12._24_4_ = iVar9;
  auVar12._28_4_ = iVar9;
  auVar19._8_4_ = 0xffd40026;
  auVar19._0_8_ = 0xffd40026ffd40026;
  auVar19._12_4_ = 0xffd40026;
  auVar19._16_4_ = 0xffd40026;
  auVar19._20_4_ = 0xffd40026;
  auVar19._24_4_ = 0xffd40026;
  auVar19._28_4_ = 0xffd40026;
  auVar20._8_2_ = 0x20;
  auVar20._0_8_ = 0x20002000200020;
  auVar20._10_2_ = 0x20;
  auVar20._12_2_ = 0x20;
  auVar20._14_2_ = 0x20;
  auVar20._16_2_ = 0x20;
  auVar20._18_2_ = 0x20;
  auVar20._20_2_ = 0x20;
  auVar20._22_2_ = 0x20;
  auVar20._24_2_ = 0x20;
  auVar20._26_2_ = 0x20;
  auVar20._28_2_ = 0x20;
  auVar20._30_2_ = 0x20;
  auVar21._8_4_ = 0xffe00020;
  auVar21._0_8_ = 0xffe00020ffe00020;
  auVar21._12_4_ = 0xffe00020;
  auVar21._16_4_ = 0xffe00020;
  auVar21._20_4_ = 0xffe00020;
  auVar21._24_4_ = 0xffe00020;
  auVar21._28_4_ = 0xffe00020;
  auVar22._8_4_ = 0x11002a;
  auVar22._0_8_ = 0x11002a0011002a;
  auVar22._12_4_ = 0x11002a;
  auVar22._16_4_ = 0x11002a;
  auVar22._20_4_ = 0x11002a;
  auVar22._24_4_ = 0x11002a;
  auVar22._28_4_ = 0x11002a;
  auVar23._8_4_ = 0xffd60011;
  auVar23._0_8_ = 0xffd60011ffd60011;
  auVar23._12_4_ = 0xffd60011;
  auVar23._16_4_ = 0xffd60011;
  auVar23._20_4_ = 0xffd60011;
  auVar23._24_4_ = 0xffd60011;
  auVar23._28_4_ = 0xffd60011;
  for (uVar10 = (ulong)(uint)(0 << bVar1); uVar10 < 0x10; uVar10 = uVar10 + 8) {
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_100 + uVar10 * 2),
                            *(undefined1 (*) [16])(auStack_c0 + uVar10 * 2));
    auVar24 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_100 + uVar10 * 2),
                             *(undefined1 (*) [16])(auStack_c0 + uVar10 * 2));
    auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_80 + uVar10 * 2),
                            *(undefined1 (*) [16])(auStack_40 + uVar10 * 2));
    auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_80 + uVar10 * 2),
                            *(undefined1 (*) [16])(auStack_40 + uVar10 * 2));
    auVar17._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar3;
    auVar17._16_16_ = ZEXT116(1) * auVar24;
    auVar5 = vpmaddwd_avx2(auVar17,_DAT_0017a660);
    auVar15._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
    auVar15._16_16_ = ZEXT116(1) * auVar2;
    auVar6 = vpmaddwd_avx2(auVar15,_DAT_0017a680);
    auVar5 = vpaddd_avx2(auVar6,auVar5);
    auVar6 = vpmaddwd_avx2(auVar17,_DAT_0017a6a0);
    auVar16 = vpmaddwd_avx2(auVar15,_DAT_0017a6c0);
    auVar6 = vpaddd_avx2(auVar16,auVar6);
    auVar16 = vpmaddwd_avx2(auVar17,_DAT_0017a6e0);
    auVar7 = vpmaddwd_avx2(auVar15,_DAT_0017a700);
    auVar16 = vpaddd_avx2(auVar7,auVar16);
    auVar7 = vpmaddwd_avx2(auVar17,_DAT_0017a720);
    auVar15 = vpmaddwd_avx2(auVar19,auVar15);
    auVar7 = vpaddd_avx2(auVar15,auVar7);
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(local_120 + uVar10),
                            *(undefined1 (*) [16])(auStack_a0 + uVar10 * 2));
    auVar24 = vpunpckhwd_avx(*(undefined1 (*) [16])(local_120 + uVar10),
                             *(undefined1 (*) [16])(auStack_a0 + uVar10 * 2));
    auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_e0 + uVar10 * 2),
                            *(undefined1 (*) [16])(auStack_60 + uVar10 * 2));
    auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_e0 + uVar10 * 2),
                            *(undefined1 (*) [16])(auStack_60 + uVar10 * 2));
    auVar13._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar3;
    auVar13._16_16_ = ZEXT116(1) * auVar24;
    auVar15 = vpmaddwd_avx2(auVar20,auVar13);
    auVar17 = vpmaddwd_avx2(auVar21,auVar13);
    auVar14._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
    auVar14._16_16_ = ZEXT116(1) * auVar2;
    auVar13 = vpmaddwd_avx2(auVar22,auVar14);
    auVar14 = vpmaddwd_avx2(auVar23,auVar14);
    auVar18 = vpsubd_avx2(auVar15,auVar13);
    auVar15 = vpaddd_avx2(auVar15,auVar12);
    auVar15 = vpaddd_avx2(auVar15,auVar13);
    auVar8 = vpsubd_avx2(auVar17,auVar14);
    auVar13 = vpaddd_avx2(auVar18,auVar12);
    auVar17 = vpaddd_avx2(auVar17,auVar12);
    auVar17 = vpaddd_avx2(auVar17,auVar14);
    auVar14 = vpaddd_avx2(auVar8,auVar12);
    auVar18 = vpaddd_avx2(auVar5,auVar15);
    auVar15 = vpsubd_avx2(auVar15,auVar5);
    auVar5 = vpaddd_avx2(auVar6,auVar17);
    auVar17 = vpsubd_avx2(auVar17,auVar6);
    auVar6 = vpaddd_avx2(auVar14,auVar16);
    auVar14 = vpsubd_avx2(auVar14,auVar16);
    auVar16 = vpaddd_avx2(auVar13,auVar7);
    auVar13 = vpsubd_avx2(auVar13,auVar7);
    auVar7 = vpsrad_avx2(auVar5,ZEXT416(uVar11));
    auVar5 = vpsrad_avx2(auVar17,ZEXT416(uVar11));
    auVar24 = ZEXT416(uVar11);
    auVar6 = vpsrad_avx2(auVar6,auVar24);
    auVar5 = vpackssdw_avx2(auVar6,auVar5);
    auVar6 = vpsrad_avx2(auVar14,auVar24);
    auVar6 = vpackssdw_avx2(auVar7,auVar6);
    auVar7 = vpsrad_avx2(auVar18,auVar24);
    auVar15 = vpsrad_avx2(auVar15,auVar24);
    auVar16 = vpsrad_avx2(auVar16,ZEXT416(uVar11));
    auVar13 = vpsrad_avx2(auVar13,ZEXT416(uVar11));
    auVar16 = vpackssdw_avx2(auVar16,auVar15);
    auVar7 = vpackssdw_avx2(auVar7,auVar13);
    auVar15 = vpunpcklwd_avx2(auVar7,auVar5);
    auVar5 = vpunpckhwd_avx2(auVar7,auVar5);
    auVar7 = vpunpcklwd_avx2(auVar6,auVar16);
    auVar6 = vpunpckhwd_avx2(auVar6,auVar16);
    auVar13 = vpunpcklwd_avx2(auVar15,auVar7);
    auVar16 = vpunpckhwd_avx2(auVar15,auVar7);
    auVar7 = vpunpcklwd_avx2(auVar5,auVar6);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
    auVar15 = vpunpcklqdq_avx2(auVar13,auVar7);
    auVar6 = vpunpckhqdq_avx2(auVar13,auVar7);
    auVar7 = vpunpcklqdq_avx2(auVar16,auVar5);
    auVar5 = vpunpckhqdq_avx2(auVar16,auVar5);
    auVar16._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar15._0_16_;
    auVar16._16_16_ = ZEXT116(0) * auVar15._16_16_ + ZEXT116(1) * auVar6._0_16_;
    auVar6 = vperm2i128_avx2(auVar15,auVar6,0x31);
    auVar18._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar7._0_16_;
    auVar18._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar5._0_16_;
    auVar5 = vperm2i128_avx2(auVar7,auVar5,0x31);
    *(undefined1 (*) [32])dst = auVar16;
    *(undefined1 (*) [32])((long)dst + 0x20) = auVar18;
    *(undefined1 (*) [32])((long)dst + 0x40) = auVar6;
    *(undefined1 (*) [32])((long)dst + 0x60) = auVar5;
    dst = (s16 *)((long)dst + 0x80);
  }
  return;
}

Assistant:

void itrans_dct2_h16_w8_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[16 * 8]);
    dct2_butterfly_h16_avx2(src, 8, tmp, 8, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h8_avx2(tmp, 16, dst, 16, 20 - bit_depth, bit_depth);
}